

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dense.cpp
# Opt level: O0

int main(void)

{
  Matrix<double,__1,__1,_0,__1,__1> *AColMajor;
  time_t tVar1;
  ostream *poVar2;
  RealScalar RVar3;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> PVar4
  ;
  __type local_100;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_e0;
  undefined1 local_a0 [8];
  RowVector residual;
  RowVector x;
  LhsNested pMStack_78;
  Solver solver;
  undefined1 local_68 [8];
  RowVector b;
  undefined1 local_48 [8];
  RowVector xopt;
  Matrix<double,__1,__1,_0,__1,__1> A;
  long ITERS;
  uint local_10;
  uint n;
  uint m;
  
  n = 0;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_10 = 100;
  ITERS._4_4_ = 10;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)
             &xopt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &local_10,(uint *)((long)&ITERS + 4));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_48,(uint *)((long)&ITERS + 4));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &xopt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  PVar4 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                     &xopt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  pMStack_78 = PVar4.m_lhs;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_68,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&stack0xffffffffffffff88);
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0;
  AColMajor = (Matrix<double,__1,__1,_0,__1,__1> *)
              ((long)&x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows + 4);
  rek::Solver::Solver((Solver *)AColMajor);
  rek::Solver::solve((Solver *)
                     &residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,AColMajor,
                     (RowVector *)
                     &xopt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows,(long)local_68);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_f8,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             &residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_48);
  local_100 = std::sqrt<unsigned_int>(ITERS._4_4_);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator/(&local_e0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_f8,&local_100);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_a0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_e0);
  poVar2 = std::operator<<((ostream *)&std::cout,"Error is ");
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_a0);
  if (RVar3 <= 0.01) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Success...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    n = 0;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_a0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_68);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &xopt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    return n;
  }
  __assert_fail("residual.norm() <= 0.01",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zouzias[P]REK-CPP/test/test_dense.cpp"
                ,0x18,"int main()");
}

Assistant:

int main() {
  srand((unsigned int)time(nullptr));
  unsigned int m = 100, n = 10;
  long ITERS = 10000;

  Matrix<double, Dynamic, Dynamic> A(m, n);
  rek::RowVector xopt(n);
  xopt.setRandom();
  A.setRandom();
  rek::RowVector b = A * xopt;

  auto solver = Solver();
  rek::RowVector x = solver.solve(A, b, ITERS);

  // Error should be small
  rek::RowVector residual = (x - xopt) / std::sqrt(n);
  std::cout << "Error is " << residual.norm() << std::endl;
  assert(residual.norm() <= 0.01);
  std::cout << "Success..." << std::endl;

  return 0;
}